

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O1

bool __thiscall
lzham::symbol_codec::encode(symbol_codec *this,uint sym,quasi_adaptive_huffman_data_model *model)

{
  uint *puVar1;
  unsigned_short *puVar2;
  bool bVar3;
  
  bVar3 = record_put_bits(this,(uint)(model->super_raw_quasi_adaptive_huffman_data_model).m_codes.
                                     m_p[sym],
                          (uint)(model->super_raw_quasi_adaptive_huffman_data_model).m_code_sizes.
                                m_p[sym]);
  if (bVar3) {
    puVar2 = (model->super_raw_quasi_adaptive_huffman_data_model).m_sym_freq.m_p + sym;
    *puVar2 = *puVar2 + 1;
    puVar1 = &(model->super_raw_quasi_adaptive_huffman_data_model).m_symbols_until_update;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      this->m_total_model_updates = this->m_total_model_updates + 1;
      bVar3 = raw_quasi_adaptive_huffman_data_model::update
                        (&model->super_raw_quasi_adaptive_huffman_data_model);
      if (!bVar3) goto LAB_0011efee;
    }
    bVar3 = true;
  }
  else {
LAB_0011efee:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool symbol_codec::encode(uint sym, quasi_adaptive_huffman_data_model& model)
   {
      LZHAM_ASSERT(m_mode == cEncoding);
      LZHAM_ASSERT(model.m_encoding);

      if (!record_put_bits(model.m_codes[sym], model.m_code_sizes[sym]))
         return false;

      uint freq = model.m_sym_freq[sym];
      freq++;
      model.m_sym_freq[sym] = static_cast<uint16>(freq);
      
      LZHAM_ASSERT(freq <= UINT16_MAX);

      if (--model.m_symbols_until_update == 0)
      {
         m_total_model_updates++;
         if (!model.update())
            return false;
      }
      return true;
   }